

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

void __thiscall
QNetworkAccessManager::QNetworkAccessManager(QNetworkAccessManager *this,QObject *parent)

{
  QBasicMutex QVar1;
  void **ppvVar2;
  QNetworkAccessManagerPrivate *this_00;
  undefined4 *puVar3;
  QBasicMutex *this_01;
  long in_FS_OFFSET;
  undefined1 local_40 [8];
  code *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkAccessManagerPrivate *)operator_new(0x108);
  QNetworkAccessManagerPrivate::QNetworkAccessManagerPrivate(this_00);
  this_01 = (QBasicMutex *)this;
  QObject::QObject((QObject *)this,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002cfb50;
  if (-2 < (char)QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i) {
    if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>>::
        instance()::holder == '\0') {
      QNetworkAccessManager((QNetworkAccessManager *)this_01);
    }
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard._q_value.
        super___atomic_base<signed_char>._M_i != -1) {
      if ((AtomicType)
          QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::mutex.d_ptr.
          _q_value._M_b._M_p == (AtomicType)0x0) {
        LOCK();
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::mutex.d_ptr.
        _q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
        UNLOCK();
      }
      else {
        this_01 = &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::
                   mutex;
        QBasicMutex::lockInternal();
      }
      if ((__atomic_base<signed_char>)
          QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard.
          _q_value.super___atomic_base<signed_char>._M_i == '\0') {
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::storage.data =
             (uchar  [16])ZEXT816(0);
        QNetworkAccessBackendFactory::QNetworkAccessBackendFactory
                  ((QNetworkAccessBackendFactory *)
                   &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::
                    storage);
        ppvVar2 = QCoreApplication::self;
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::storage.data.
        _0_8_ = &PTR_metaObject_002cfaa0;
        local_38 = QObject::destroyed;
        local_30 = 0;
        puVar3 = (undefined4 *)operator_new(0x18);
        *puVar3 = 1;
        *(code **)(puVar3 + 2) =
             QtPrivate::QCallableObject<void_(*)(),_QtPrivate::List<>,_void>::impl;
        *(code **)(puVar3 + 4) =
             QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::reset;
        this_01 = (QBasicMutex *)local_40;
        QObject::connectImpl
                  ((QObject *)this_01,ppvVar2,(QObject *)&local_38,ppvVar2,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar3,(int *)0x1,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)this_01);
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard._q_value.
        super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      }
      QVar1.d_ptr._q_value._M_b._M_p =
           QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::mutex.d_ptr.
           _q_value._M_b._M_p;
      LOCK();
      QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::mutex.d_ptr.
      _q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
      UNLOCK();
      if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
        this_01 = &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::
                   mutex;
        QBasicMutex::unlockInternalFutex
                  (&QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::
                    mutex);
      }
    }
  }
  QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded((QNetworkAccessManagerPrivate *)this_01);
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType.typeId.
      _q_value.super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QList<std::pair<QByteArray,_QByteArray>_>_>::metaType.
      typeId._q_value.super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QList<std::pair<QByteArray,_QByteArray>_>_>::
                metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QSharedPointer<char>_>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QSharedPointer<char>_>::metaType);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkAccessManager::QNetworkAccessManager(QObject *parent)
    : QObject(*new QNetworkAccessManagerPrivate, parent)
{
    ensureInitialized();
    d_func()->ensureBackendPluginsLoaded();

    qRegisterMetaType<QNetworkReply::NetworkError>();
#ifndef QT_NO_NETWORKPROXY
    qRegisterMetaType<QNetworkProxy>();
#endif
#ifndef QT_NO_SSL
    qRegisterMetaType<QList<QSslError> >();
    qRegisterMetaType<QSslConfiguration>();
    qRegisterMetaType<QSslPreSharedKeyAuthenticator *>();
#endif
    qRegisterMetaType<QList<std::pair<QByteArray, QByteArray>>>();
#if QT_CONFIG(http)
    qRegisterMetaType<QHttpNetworkRequest>();
#endif
    qRegisterMetaType<QNetworkReply::NetworkError>();
    qRegisterMetaType<QSharedPointer<char> >();
}